

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double expected_sd_cat_single<unsigned_long,unsigned_long,double>
                 (unsigned_long *counts,double *p,size_t n,unsigned_long *pos,size_t cat_exclude,
                 unsigned_long cnt)

{
  double dVar1;
  unsigned_long uVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (cat_exclude == 0) {
    pos = pos + 1;
  }
  else if (n - 1 != cat_exclude) {
    uVar2 = pos[cat_exclude];
    if (n != 0) {
      lVar4 = cnt - counts[uVar2];
      auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = 0x45300000;
      sVar5 = 0;
      do {
        p[pos[sVar5]] =
             (((double)CONCAT44(0x45300000,(int)(counts[pos[sVar5]] >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)counts[pos[sVar5]]) - 4503599627370496.0)) /
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
        sVar5 = sVar5 + 1;
      } while (n != sVar5);
    }
    dVar6 = p[*pos];
    auVar9._8_8_ = -dVar6 * dVar6;
    auVar9._0_8_ = dVar6;
    auVar7 = divpd(auVar9,_DAT_0036b2a0);
    sVar5 = (ulong)(cat_exclude == 1) | 2;
    dVar1 = p[pos[(ulong)(cat_exclude == 1) + 1]];
    auVar8._8_8_ = dVar1 * dVar1;
    auVar8._0_8_ = dVar1;
    auVar9 = divpd(auVar8,_DAT_0036b2a0);
    dVar6 = ((auVar7._8_8_ + dVar6 * dVar1 * -0.5 + auVar7._0_8_) - auVar9._8_8_) + auVar9._0_8_;
    if (sVar5 < n) {
      do {
        if (pos[sVar5] != uVar2) {
          dVar1 = p[pos[sVar5]];
          auVar10._8_8_ = dVar1 * dVar1;
          auVar10._0_8_ = dVar1;
          auVar7 = divpd(auVar10,_DAT_0036b2a0);
          dVar6 = dVar6 + (auVar7._0_8_ - auVar7._8_8_);
          sVar3 = 0;
          do {
            if (pos[sVar3] != uVar2) {
              dVar6 = dVar6 + p[pos[sVar3]] * dVar1 * -0.5;
            }
            sVar3 = sVar3 + 1;
          } while (sVar5 != sVar3);
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != n);
    }
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    return SQRT(dVar6);
  }
  dVar6 = expected_sd_cat<unsigned_long,unsigned_long,double>(counts,p,n - 1,pos);
  return dVar6;
}

Assistant:

double expected_sd_cat_single(number *restrict counts, double *restrict p, size_t n, int_t *restrict pos, size_t cat_exclude, number cnt)
{
    if (cat_exclude == 0)
        return expected_sd_cat<number, int_t, ldouble_safe>(counts, p, n-1, pos + 1);

    else if (cat_exclude == (n-1))
        return expected_sd_cat<number, int_t, ldouble_safe>(counts, p, n-1, pos);

    size_t ix_exclude = pos[cat_exclude];

    ldouble_safe cnt_div = (ldouble_safe) (cnt - counts[ix_exclude]);
    for (size_t cat = 0; cat < n; cat++)
        p[pos[cat]] = (ldouble_safe)counts[pos[cat]] / cnt_div;

    ldouble_safe cum_var;
    if (cat_exclude != 1)
        cum_var = -square(p[pos[0]]) / 3.0 - p[pos[0]] * p[pos[1]] / 2.0 + p[pos[0]] / 3.0  - square(p[pos[1]]) / 3.0 + p[pos[1]] / 3.0;
    else
        cum_var = -square(p[pos[0]]) / 3.0 - p[pos[0]] * p[pos[2]] / 2.0 + p[pos[0]] / 3.0  - square(p[pos[2]]) / 3.0 + p[pos[2]] / 3.0;
    for (size_t cat1 = (cat_exclude == 1)? 3 : 2; cat1 < n; cat1++)
    {
        if (pos[cat1] == ix_exclude) continue;
        cum_var += p[pos[cat1]] / 3.0 - square(p[pos[cat1]]) / 3.0;
        for (size_t cat2 = 0; cat2 < cat1; cat2++)
        {
            if (pos[cat2] == ix_exclude) continue;
            cum_var -= p[pos[cat1]] * p[pos[cat2]] / 2.0;
        }

    }
    return std::sqrt(std::fmax(cum_var, (ldouble_safe)0));
}